

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

pair<cmQtAutoGen::IntegerVersion,_unsigned_int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget *target)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  cmMakefile *this;
  char *pcVar4;
  pointer pIVar5;
  reference pvVar6;
  long lVar7;
  value_type vVar8;
  value_type vVar9;
  string *prefix;
  ulong uVar10;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar11;
  anon_class_8_1_6971b95b addVersion;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> knownQtVersions;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"QT_MAJOR_VERSION",(allocator<char> *)&knownQtVersions);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"",(allocator<char> *)&addVersion);
  pcVar3 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(target,&local_50,&local_70);
  uVar1 = CharPtrToUInt(pcVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_,
                 "Qt6Core",(allocator<char> *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ + 0x20),
                 "Qt5Core",(allocator<char> *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ + 0x40),"QT",
                 (allocator<char> *)&addVersion);
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                   ::~array,GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_);
    }
  }
  knownQtVersions.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  knownQtVersions.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  knownQtVersions.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::reserve
            (&knownQtVersions,6);
  addVersion.result = &knownQtVersions;
  this = cmTarget::GetMakefile(target->Target);
  for (lVar7 = 0; lVar7 != 0x60; lVar7 = lVar7 + 0x20) {
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ + lVar7),
                   "_VERSION_MAJOR");
    pcVar3 = cmMakefile::GetDefinition(this,&local_50);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ + lVar7),
                   "_VERSION_MINOR");
    pcVar4 = cmMakefile::GetDefinition(this,&local_70);
    GetKnownQtVersions::anon_class_8_1_6971b95b::operator()(&addVersion,pcVar3,pcVar4);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  for (lVar7 = 0; lVar7 != 0x60; lVar7 = lVar7 + 0x20) {
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ + lVar7),
                   "_VERSION_MAJOR");
    pcVar3 = cmMakefile::GetProperty(this,&local_50);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ + lVar7),
                   "_VERSION_MINOR");
    pcVar4 = cmMakefile::GetProperty(this,&local_70);
    GetKnownQtVersions::anon_class_8_1_6971b95b::operator()(&addVersion,pcVar3,pcVar4);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  vVar8.Major = 0;
  vVar8.Minor = 0;
  vVar9.Major = 0;
  vVar9.Minor = 0;
  if (knownQtVersions.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      knownQtVersions.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar10 = 0;
  }
  else {
    pIVar5 = knownQtVersions.
             super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar1 == 0) {
      pvVar6 = std::
               vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::at
                         (&knownQtVersions,0);
      vVar9 = *pvVar6;
      uVar10 = (ulong)vVar9 >> 0x20;
    }
    else {
      for (; pIVar5 != knownQtVersions.
                       super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pIVar5 = pIVar5 + 1) {
        if (pIVar5->Major == uVar1) {
          uVar10 = (ulong)pIVar5->Minor;
          vVar9.Minor = 0;
          vVar9.Major = uVar1;
          goto LAB_002edd3e;
        }
      }
      uVar10 = 0;
      vVar9 = vVar8;
    }
  }
LAB_002edd3e:
  std::_Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::
  ~_Vector_base(&knownQtVersions.
                 super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
               );
  pVar11.first = (IntegerVersion)((ulong)vVar9 & 0xffffffff | uVar10 << 0x20);
  pVar11.second = uVar1;
  return pVar11;
}

Assistant:

std::pair<cmQtAutoGen::IntegerVersion, unsigned int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget const* target)
{
  std::pair<IntegerVersion, unsigned int> res(
    IntegerVersion(),
    CharPtrToUInt(target->GetLinkInterfaceDependentStringProperty(
      "QT_MAJOR_VERSION", "")));

  auto knownQtVersions = GetKnownQtVersions(target);
  if (!knownQtVersions.empty()) {
    if (res.second == 0) {
      // No specific version was requested by the target:
      // Use highest known Qt version.
      res.first = knownQtVersions.at(0);
    } else {
      // Pick a version from the known versions:
      for (auto it : knownQtVersions) {
        if (it.Major == res.second) {
          res.first = it;
          break;
        }
      }
    }
  }
  return res;
}